

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

Result __thiscall
testing::Action<unsigned_short_(unsigned_short)>::Perform
          (Action<unsigned_short_(unsigned_short)> *this,ArgumentTuple *args)

{
  ActionInterface<unsigned_short_(unsigned_short)> *pAVar1;
  unsigned_short uVar2;
  int iVar3;
  undefined8 in_RAX;
  _Manager_type p_Var4;
  undefined8 uStack_18;
  
  p_Var4 = (this->fun_).super__Function_base._M_manager;
  uStack_18 = in_RAX;
  if ((this->impl_).value_ == (ActionInterface<unsigned_short_(unsigned_short)> *)0x0 &&
      p_Var4 == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O3/_deps/googletest-src/googlemock/include/gmock/gmock-actions.h"
               ,0x193);
    p_Var4 = (this->fun_).super__Function_base._M_manager;
  }
  if (p_Var4 != (_Manager_type)0x0) {
    uStack_18 = CONCAT26((args->super__Tuple_impl<0UL,_unsigned_short>).
                         super__Head_base<0UL,_unsigned_short,_false>._M_head_impl,
                         (undefined6)uStack_18);
    uVar2 = (*(this->fun_)._M_invoker)((_Any_data *)this,(unsigned_short *)((long)&uStack_18 + 6));
    return uVar2;
  }
  pAVar1 = (this->impl_).value_;
  iVar3 = (*pAVar1->_vptr_ActionInterface[2])(pAVar1,args);
  return (Result)iVar3;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
#if GTEST_LANG_CXX11
    if (fun_ != nullptr) {
      return internal::Apply(fun_, ::std::move(args));
    }
#endif
    return impl_->Perform(args);
  }